

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer * __thiscall
FSerializer::Array<PalEntry>(FSerializer *this,char *key,PalEntry *obj,int count,bool fullcompare)

{
  bool bVar1;
  uint uVar2;
  int local_38;
  int i;
  int max;
  bool fullcompare_local;
  int count_local;
  PalEntry *obj_local;
  char *key_local;
  FSerializer *this_local;
  
  if (((((save_full) || (!fullcompare)) || (bVar1 = isWriting(this), !bVar1)) ||
      (bVar1 = nullcmp(obj,(long)count << 2), !bVar1)) && (bVar1 = BeginArray(this,key), bVar1)) {
    bVar1 = isReading(this);
    max = count;
    if ((bVar1) && (uVar2 = ArraySize(this), max = count, (int)uVar2 < count)) {
      max = uVar2;
    }
    for (local_38 = 0; local_38 < max; local_38 = local_38 + 1) {
      ::Serialize(this,(char *)0x0,obj + local_38,(PalEntry *)0x0);
    }
    EndArray(this);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && nullcmp(obj, count * sizeof(T)))
		{
			return *this;
		}

		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], (T*)nullptr);
			}
			EndArray();
		}
		return *this;
	}